

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O0

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
BipartiteGraph::vertex_cover
          (BipartiteGraph *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *Aindex,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Bindex)

{
  bool bVar1;
  bool bVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference __b;
  double *pdVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  *in_RSI;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_RDI;
  double dVar11;
  bool scanning;
  vector<unsigned_long,_std::allocator<unsigned_long>_> BScanList;
  vector<unsigned_long,_std::allocator<unsigned_long>_> AScanList;
  bool augmentingPathEndMINUS1;
  size_t Bpathnode;
  size_t Apathnode;
  size_t augmentingPathEnd;
  size_t BScanListSize;
  size_t AScanListSize;
  size_t k;
  size_t j;
  size_t i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ABflow;
  double total;
  size_t nBVC;
  size_t nAVC;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *CD;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc88;
  deque<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc90;
  allocator_type *in_stack_fffffffffffffc98;
  vector<Vertex,_std::allocator<Vertex>_> *pvVar12;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffca0;
  size_type in_stack_fffffffffffffca8;
  value_type vVar13;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  undefined8 local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  undefined8 local_f0;
  byte local_ca;
  byte local_c9;
  size_type local_c8;
  size_type local_c0;
  size_type local_b8;
  ulong local_b0;
  size_type local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  ulong local_98;
  ulong local_90;
  undefined8 local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_50;
  double local_38;
  size_type local_30;
  size_type local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  local_30 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  local_38 = 0.0;
  local_70 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x154184);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (value_type_conflict *)in_stack_fffffffffffffca0,
             (allocator_type *)in_stack_fffffffffffffc98);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1541c0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
           (allocator_type *)in_stack_fffffffffffffc98);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1541f4);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffca0);
  std::allocator<double>::~allocator((allocator<double> *)0x15420e);
  local_90 = 0;
  local_98 = 0;
  local_a0 = (vector<double,_std::allocator<double>_> *)0x0;
  local_a8 = 0;
  local_b0 = 0;
  local_b8 = 0;
  local_c0 = 0;
  local_c8 = 0;
  local_c9 = 1;
  local_ca = 0;
  local_f0 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1542b3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8,(value_type_conflict1 *)in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x1542ef);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
           (value_type *)in_stack_fffffffffffffca0,(allocator_type *)in_stack_fffffffffffffc98);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x154320);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffca0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x15433a);
  local_118 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x15436f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8,(value_type_conflict1 *)in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1543a3);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1543d8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8,(value_type_conflict1 *)in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x15440c);
  local_38 = 0.0;
  for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_18,local_90);
    pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                       ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
    local_38 = pvVar4->weight + local_38;
  }
  for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_18,local_90);
    pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                       ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
    dVar11 = pvVar4->weight / local_38;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_18,local_90);
    pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                       ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
    pvVar4->residual = dVar11;
  }
  local_38 = 0.0;
  for (local_98 = 0; local_98 < local_30; local_98 = local_98 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_20,local_98);
    pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                       ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar3);
    local_38 = pvVar4->weight + local_38;
  }
  for (local_98 = 0; local_98 < local_30; local_98 = local_98 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_20,local_98);
    pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                       ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar3);
    dVar11 = pvVar4->weight / local_38;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_20,local_98);
    pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                       ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar3);
    pvVar4->residual = dVar11;
  }
  local_38 = 1.0;
  do {
    if (local_38 <= 0.0) {
      local_ca = 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffca0)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffca0)
      ;
      if ((local_ca & 1) == 0) {
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffffca0);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_fffffffffffffca0);
      return in_RDI;
    }
    local_38 = 0.0;
    for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_18,local_90);
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
      pvVar4->label = -1.0;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_18,local_90);
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
      pvVar4->pred = -1;
    }
    for (local_98 = 0; local_98 < local_30; local_98 = local_98 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_20,local_98);
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar3);
      pvVar4->label = -1.0;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_20,local_98);
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar3);
      pvVar4->pred = -1;
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),local_98);
      pvVar4->label = -1.0;
    }
    local_a8 = 0;
    for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_18,local_90);
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
      if (pvVar4->residual <= 0.0) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_18,local_90);
        pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                           ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
        pvVar4->label = -1.0;
      }
      else {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_18,local_90);
        pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                           ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
        dVar11 = pvVar4->residual;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_18,local_90);
        pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                           ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
        pvVar4->label = dVar11;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_18,local_90);
        vVar13 = *pvVar3;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_110,local_a8);
        *pvVar5 = vVar13;
        local_a8 = local_a8 + 1;
      }
    }
    bVar2 = true;
LAB_00154b77:
    bVar1 = false;
    if (local_a8 != 0) {
      bVar1 = bVar2;
    }
    if (bVar1) {
      local_b0 = 0;
      for (local_90 = 0; local_90 < local_a8; local_90 = local_90 + 1) {
        for (local_98 = 0; local_98 < local_30; local_98 = local_98 + 1) {
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_110,local_90);
          std::
          vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
          ::operator[](in_RSI,*pvVar5);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_20,local_98);
          pvVar6 = std::deque<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
          if ((*pvVar6 & 1U) != 0) {
            pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_20,local_98);
            pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                               ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar3);
            if ((pvVar4->label == -1.0) && (!NAN(pvVar4->label))) {
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_110,local_90);
              pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                                 ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar5);
              dVar11 = pvVar4->label;
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (local_20,local_98);
              pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                                 ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar3);
              pvVar4->label = dVar11;
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_110,local_90);
              vVar13 = *pvVar5;
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (local_20,local_98);
              pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                                 ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar3);
              pvVar4->pred = (int)vVar13;
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (local_20,local_98);
              vVar13 = *pvVar3;
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_138,local_b0);
              *pvVar5 = vVar13;
              local_b0 = local_b0 + 1;
            }
          }
        }
      }
      local_a8 = 0;
      for (local_98 = 0; local_98 < local_b0; local_98 = local_98 + 1) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_138,local_98);
        pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                           ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar5);
        if (0.0 < pvVar4->residual) {
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_138,local_98);
          pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                             ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar5);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_138,local_98);
          __b = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                          ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar5);
          pdVar7 = std::min<double>(&pvVar4->residual,&__b->label);
          local_38 = *pdVar7;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_138,local_98);
          local_b8 = *pvVar5;
          local_c9 = 0;
          bVar2 = false;
          break;
        }
        for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_18,local_90);
          std::
          vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
          ::operator[](in_RSI,*pvVar3);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&local_138,local_98);
          pvVar6 = std::deque<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
          if ((*pvVar6 & 1U) != 0) {
            pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_18,local_90);
            pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                               ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3);
            if ((pvVar4->label == -1.0) && (!NAN(pvVar4->label))) {
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (local_18,local_90);
              pvVar8 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_50,*pvVar3);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_138,local_98);
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,*pvVar5);
              if (0.0 < *pvVar9) {
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_138,local_98);
                pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                                   ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),*pvVar5)
                ;
                pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (local_18,local_90);
                pvVar8 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[](&local_50,*pvVar3);
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_138,local_98);
                pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,*pvVar5);
                pdVar7 = std::min<double>(&pvVar4->label,pvVar9);
                dVar11 = *pdVar7;
                pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (local_18,local_90);
                pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                                   ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3)
                ;
                pvVar4->label = dVar11;
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_138,local_98);
                vVar13 = *pvVar5;
                pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (local_18,local_90);
                pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                                   ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),*pvVar3)
                ;
                pvVar4->pred = (int)vVar13;
                pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (local_18,local_90);
                vVar13 = *pvVar3;
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_110,local_a8);
                *pvVar5 = vVar13;
                local_a8 = local_a8 + 1;
              }
            }
          }
        }
      }
      goto LAB_00154b77;
    }
    if (local_38 <= 0.0) {
      local_a0 = (vector<double,_std::allocator<double>_> *)0x0;
      for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
        pvVar12 = (vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2);
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_18,local_90);
        pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[](pvVar12,*pvVar3);
        if ((pvVar4->label == -1.0) && (!NAN(pvVar4->label))) {
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_18,local_90);
          vVar13 = *pvVar3;
          pvVar10 = std::
                    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::operator[](in_RDI,2);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar10,(size_type)local_a0);
          *pvVar5 = vVar13;
          local_a0 = (vector<double,_std::allocator<double>_> *)
                     ((long)&(local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                             .super__Vector_impl_data._M_start + 1);
        }
      }
      in_stack_fffffffffffffca0 = local_a0;
      pvVar10 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](in_RDI,0);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar10,0);
      *pvVar5 = (value_type)in_stack_fffffffffffffca0;
      local_a0 = (vector<double,_std::allocator<double>_> *)0x0;
      for (local_98 = 0; local_98 < local_30; local_98 = local_98 + 1) {
        pvVar12 = (vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3);
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_20,local_98);
        pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[](pvVar12,*pvVar3);
        if (0.0 <= pvVar4->label) {
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_20,local_98);
          in_stack_fffffffffffffc90 = (deque<bool,_std::allocator<bool>_> *)*pvVar3;
          pvVar10 = std::
                    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::operator[](in_RDI,3);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar10,(size_type)local_a0);
          *pvVar5 = (value_type)in_stack_fffffffffffffc90;
          local_a0 = (vector<double,_std::allocator<double>_> *)((long)local_a0 + 1);
        }
      }
      in_stack_fffffffffffffc88 = local_a0;
      pvVar10 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](in_RDI,1);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar10,0);
      *pvVar5 = (value_type)in_stack_fffffffffffffc88;
    }
    else if ((local_c9 & 1) == 0) {
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),local_b8);
      dVar11 = pvVar4->residual - local_38;
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),local_b8);
      pvVar4->residual = dVar11;
      local_c8 = local_b8;
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),local_b8);
      local_c0 = (size_type)pvVar4->pred;
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_50,local_c0);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,local_c8);
      dVar11 = *pvVar9 + local_38;
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_50,local_c0);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,local_c8);
      *pvVar9 = dVar11;
      while (pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                                ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),local_c0),
            pvVar4->pred != -1) {
        pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                           ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),local_c0);
        local_c8 = (size_type)pvVar4->pred;
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_50,local_c0);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,local_c8);
        dVar11 = *pvVar9 - local_38;
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_50,local_c0);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,local_c8);
        *pvVar9 = dVar11;
        pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                           ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 3),local_c8);
        local_c0 = (size_type)pvVar4->pred;
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_50,local_c0);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,local_c8);
        dVar11 = *pvVar9 + local_38;
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_50,local_c0);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,local_c8);
        *pvVar9 = dVar11;
      }
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),local_c0);
      dVar11 = pvVar4->residual - local_38;
      pvVar4 = std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
                         ((vector<Vertex,_std::allocator<Vertex>_> *)(in_RSI + 2),local_c0);
      pvVar4->residual = dVar11;
    }
  } while( true );
}

Assistant:

vector<vector<size_t>> BipartiteGraph::vertex_cover(const vector<size_t>& Aindex, const vector<size_t>& Bindex) {
    size_t nAVC = Aindex.size(), nBVC = Bindex.size(); //nAVC,nBVC=size of A and B
    double total = 0;
    vector<vector<double>> ABflow(nA, vector<double>(nB, 0.0));
    size_t i=0, j=0, k=0, AScanListSize=0, BScanListSize=0, augmentingPathEnd=0, Apathnode=0, Bpathnode=0;
    bool augmentingPathEndMINUS1 = true;
    vector<vector<size_t>> CD(4, vector<size_t>(this->n, 0)); //output: incidence vectors of vertex covers, CD[0]=Aside; CD[1]=Bside;
    vector<size_t> AScanList(nA, 0);
    vector<size_t> BScanList(nB, 0);

    /* First set normalized weights */
    total = 0;
    for (i = 0; i < nAVC; i++)
        total += this->Avertex[Aindex[i]].weight;
    for (i = 0; i < nAVC; i++)
        this->Avertex[Aindex[i]].residual = this->Avertex[Aindex[i]].weight / total;

    total = 0;
    for (j = 0; j < nBVC; j++)
        total += this->Bvertex[Bindex[j]].weight;
    for (j = 0; j < nBVC; j++)
        this->Bvertex[Bindex[j]].residual = this->Bvertex[Bindex[j]].weight / total;

    /* Now comes the flow algorithm
     * Flow on outside arcs are represented by Vertex[i].residual
     * Flow on inside arcs are represented by ABflow
     * Initialize ABflow to 0, start scanlist
     */

    total = 1; //flow augmentation in last stage
    while (total > 0) {
        //Scan Phase
        //Set labels
        total = 0;
        for (i = 0; i < nAVC; i++) {
            Avertex[Aindex[i]].label = -1;
            Avertex[Aindex[i]].pred = -1;
        }
        for (j = 0; j < nBVC; j++) {
            Bvertex[Bindex[j]].label = -1;
            Bvertex[Bindex[j]].pred = -1;
            Bvertex[j].label = -1;
        }
        AScanListSize = 0;
        for (i = 0; i < nAVC; i++) {
            if (Avertex[Aindex[i]].residual > 0) {
                Avertex[Aindex[i]].label = Avertex[Aindex[i]].residual;
                AScanList[AScanListSize] = Aindex[i];
                AScanListSize++;
            }
            else {
                Avertex[Aindex[i]].label = -1;
            }
        }
//        for (i = 0; i < nBVC; i++) {
//            Bvertex[i].label = -1;
//        }

        // scan for an augmenting path
        bool scanning = true;
        while (AScanListSize != 0 && scanning) {
            /* Scan the A side nodes*/
            BScanListSize = 0;
            for (i = 0; i < AScanListSize; i++) {
                for (j = 0; j < nBVC; j++) {
                    if (edge[AScanList[i]][Bindex[j]] && Bvertex[Bindex[j]].label == -1) {
                        Bvertex[Bindex[j]].label = Avertex[AScanList[i]].label;
                        Bvertex[Bindex[j]].pred = AScanList[i];
                        BScanList[BScanListSize] = Bindex[j];
                        BScanListSize++;
                    }
                }
            }
            /* Scan the B side nodes*/
            AScanListSize = 0;
            for (j = 0; j < BScanListSize; j++) {
                if (Bvertex[BScanList[j]].residual > 0) {
                    total = min(Bvertex[BScanList[j]].residual, Bvertex[BScanList[j]].label);
                    augmentingPathEnd = BScanList[j];
                    augmentingPathEndMINUS1 = false;
                    scanning = false;
                    break;
                } else {
                    for (i = 0; i < nAVC; i++) {
                        if (edge[Aindex[i]][BScanList[j]] && Avertex[Aindex[i]].label == -1 && ABflow[Aindex[i]][BScanList[j]] > 0) {
                            Avertex[Aindex[i]].label = min(Bvertex[BScanList[j]].label, ABflow[Aindex[i]][BScanList[j]]);
                            Avertex[Aindex[i]].pred = BScanList[j];
                            AScanList[AScanListSize] = Aindex[i];
                            AScanListSize++;
                        }
                    }
                }
            }
        }//scanning procedure

        if (total > 0) { // flow augmentation
            if (!augmentingPathEndMINUS1) {
                Bvertex[augmentingPathEnd].residual = Bvertex[augmentingPathEnd].residual - total;
                Bpathnode = augmentingPathEnd;
                Apathnode = Bvertex[Bpathnode].pred;

                ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] + total;
                while (Avertex[Apathnode].pred != -1) {
                    Bpathnode = Avertex[Apathnode].pred;
                    ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] - total;
                    Apathnode = Bvertex[Bpathnode].pred;
                    ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] + total;

                }
                Avertex[Apathnode].residual = Avertex[Apathnode].residual - total;
            }
        } else { //min vertex cover found, unlabeled A's, labeled B's
            k = 0;
            for (i = 0; i < nAVC; i++)
                if (Avertex[Aindex[i]].label == -1) {
                    CD[2][k] = Aindex[i];
                    k++;
                }
            CD[0][0] = k;
            k = 0;
            for (j = 0; j < nBVC; j++)
                if (Bvertex[Bindex[j]].label >= 0) {
                    CD[3][k] = Bindex[j];
                    k++;
                }
            CD[1][0] = k;
        }
    }//flow algorithm
    return CD;

}